

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void scalar_compress(scalar *s,int bits)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = 0;
  do {
    bVar1 = (byte)bits & 0x1f;
    uVar4 = (uint)s->c[lVar2] << bVar1;
    lVar3 = (ulong)uVar4 * 0x13af;
    uVar4 = (int)((ulong)lVar3 >> 0x18) * -0xd01 + uVar4;
    if (CONCAT31((int3)((uint)(0 << bVar1) >> 8),uVar4 < 0x1a02) == 0) {
      __assert_fail("constant_time_declassify_int(remainder < 2u * kPrime)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                    ,0x215,"uint16_t compress(uint16_t, int)");
    }
    s->c[lVar2] = (((short)((ulong)lVar3 >> 0x18) - (ushort)(uVar4 < 0x681)) + 2) -
                  (ushort)(uVar4 < 0x1382) & ~(ushort)(-1 << ((byte)bits & 0x1f));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static void scalar_compress(scalar *s, int bits) {
  for (int i = 0; i < DEGREE; i++) {
    s->c[i] = compress(s->c[i], bits);
  }
}